

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_function_check_names(JSParseState *s,JSFunctionDef *fd,JSAtom func_name)

{
  ushort uVar1;
  JSAtom JVar2;
  int iVar3;
  char *fmt;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((fd->js_mode & 1) == 0) {
LAB_0015954f:
    if ((((fd->has_simple_parameter_list == 0) ||
         (uVar1 = *(ushort *)&fd->field_0x84, uVar1 == 0x602)) || ((char)(uVar1 >> 8) == '\x06')) ||
       (uVar1 >> 8 == 3)) {
LAB_001595e2:
      if (0 < (long)fd->arg_count) {
        lVar4 = 0;
        fmt = "duplicate argument names not allowed in this context";
        lVar5 = 0;
        do {
          JVar2 = fd->args[lVar5].var_name;
          if (JVar2 != 0) {
            if (lVar5 != 0) {
              lVar6 = 0;
              do {
                if (*(JSAtom *)((long)&fd->args->var_name + lVar6) == JVar2) goto LAB_00159684;
                lVar6 = lVar6 + 0x10;
              } while (lVar4 != lVar6);
            }
            if (0 < (long)fd->var_count) {
              lVar6 = 0;
              do {
                if ((*(JSAtom *)((long)&fd->vars->var_name + lVar6) == JVar2) &&
                   (*(int *)((long)&fd->vars->scope_level + lVar6) == 0)) goto LAB_00159684;
                lVar6 = lVar6 + 0x10;
              } while ((long)fd->var_count * 0x10 != lVar6);
            }
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar5 != fd->arg_count);
      }
    }
    iVar3 = 0;
  }
  else {
    if ((fd->has_simple_parameter_list == 0) && (fd->has_use_strict != 0)) {
      fmt = "\"use strict\" not allowed in function with default or destructuring parameter";
    }
    else {
      fmt = "invalid function name in strict code";
      if ((func_name != 0x3a) && (func_name != 0x4d)) {
        if (0 < (long)fd->arg_count) {
          lVar4 = 0;
          do {
            iVar3 = *(int *)((long)&fd->args->var_name + lVar4);
            if ((iVar3 == 0x3a) || (iVar3 == 0x4d)) {
              fmt = "invalid argument name in strict code";
              goto LAB_00159684;
            }
            lVar4 = lVar4 + 0x10;
          } while ((long)fd->arg_count * 0x10 != lVar4);
        }
        if ((fd->js_mode & 1) == 0) goto LAB_0015954f;
        goto LAB_001595e2;
      }
    }
LAB_00159684:
    js_parse_error(s,fmt);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int js_parse_function_check_names(JSParseState *s, JSFunctionDef *fd,
                                         JSAtom func_name)
{
    JSAtom name;
    int i, idx;

    if (fd->js_mode & JS_MODE_STRICT) {
        if (!fd->has_simple_parameter_list && fd->has_use_strict) {
            return js_parse_error(s, "\"use strict\" not allowed in function with default or destructuring parameter");
        }
        if (func_name == JS_ATOM_eval || func_name == JS_ATOM_arguments) {
            return js_parse_error(s, "invalid function name in strict code");
        }
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;

            if (name == JS_ATOM_eval || name == JS_ATOM_arguments) {
                return js_parse_error(s, "invalid argument name in strict code");
            }
        }
    }
    /* check async_generator case */
    if ((fd->js_mode & JS_MODE_STRICT)
    ||  !fd->has_simple_parameter_list
    ||  (fd->func_type == JS_PARSE_FUNC_METHOD && fd->func_kind == JS_FUNC_ASYNC)
    ||  fd->func_type == JS_PARSE_FUNC_ARROW
    ||  fd->func_type == JS_PARSE_FUNC_METHOD) {
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;
            if (name != JS_ATOM_NULL) {
                for (i = 0; i < idx; i++) {
                    if (fd->args[i].var_name == name)
                        goto duplicate;
                }
                /* Check if argument name duplicates a destructuring parameter */
                /* XXX: should have a flag for such variables */
                for (i = 0; i < fd->var_count; i++) {
                    if (fd->vars[i].var_name == name &&
                        fd->vars[i].scope_level == 0)
                        goto duplicate;
                }
            }
        }
    }
    return 0;

duplicate:
    return js_parse_error(s, "duplicate argument names not allowed in this context");
}